

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

bool mkvmuxer::WriteEbmlMasterElement(IMkvWriter *writer,uint64 type,uint64 size)

{
  int32 iVar1;
  bool bVar2;
  
  if (writer != (IMkvWriter *)0x0) {
    iVar1 = WriteID(writer,type);
    if (iVar1 == 0) {
      iVar1 = WriteUInt(writer,size);
      bVar2 = iVar1 == 0;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool WriteEbmlMasterElement(IMkvWriter* writer, uint64 type, uint64 size) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, size))
    return false;

  return true;
}